

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Query.cpp
# Opt level: O0

Dims * adios2::query::split(string *s,char delim)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  istream *__x;
  char in_DL;
  string *in_RSI;
  Dims *in_RDI;
  size_t val;
  stringstream curr;
  string item;
  stringstream ss;
  Dims *dim;
  Dims *this;
  ulong local_360;
  stringstream local_358 [392];
  string local_1d0 [48];
  stringstream local_1a0 [398];
  byte local_12;
  char local_11;
  string *local_10;
  
  local_12 = 0;
  this = in_RDI;
  local_11 = in_DL;
  local_10 = in_RSI;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xd2788a);
  _Var2 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_1a0,local_10,_Var2);
  std::__cxx11::string::string(local_1d0);
  while( true ) {
    __x = std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)local_1a0,local_1d0,local_11);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(__x + *(long *)(*(long *)__x + -0x18)));
    if (!bVar1) break;
    _Var2 = std::operator|(_S_out,_S_in);
    std::__cxx11::stringstream::stringstream(local_358,local_1d0,_Var2);
    std::istream::operator>>(local_358,&local_360);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(this,(value_type *)__x);
    std::__cxx11::stringstream::~stringstream(local_358);
  }
  local_12 = 1;
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  if ((local_12 & 1) == 0) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(this);
  }
  return in_RDI;
}

Assistant:

adios2::Dims split(const std::string &s, char delim)
{
    adios2::Dims dim;

    std::stringstream ss(s);
    std::string item;

    while (getline(ss, item, delim))
    {
        std::stringstream curr(item);
        size_t val;
        curr >> val;
        dim.push_back(val);
    }

    return dim;
}